

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::Texture2DFormatCase::init(Texture2DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  ostream *poVar2;
  MessageBuilder *pMVar3;
  Texture2D *this_01;
  Texture2D *pTVar4;
  PixelBufferAccess *access;
  Enum<int,_2UL> EVar5;
  LogGradientFmt local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  MessageBuilder local_3a8;
  GetNameFunc local_228;
  int local_220;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1e8;
  undefined1 local_1d8 [8];
  ostringstream fmtName;
  TextureFormatInfo spec;
  TextureFormat fmt;
  TestLog *log;
  Texture2DFormatCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  spec.lookupBias.m_data._8_8_ = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&fmtName.field_0x170,(TextureFormat *)(spec.lookupBias.m_data + 2)
            );
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  EVar5 = glu::getTextureFormatStr(this->m_format);
  local_208 = EVar5.m_getName;
  local_200 = EVar5.m_value;
  local_1e8.m_getName = local_208;
  local_1e8.m_value = local_200;
  poVar2 = tcu::Format::operator<<((ostream *)local_1d8,&local_1e8);
  poVar2 = std::operator<<(poVar2,", ");
  EVar5 = glu::getTypeStr(this->m_dataType);
  local_228 = EVar5.m_getName;
  local_220 = EVar5.m_value;
  local_218.m_getName = local_228;
  local_218.m_value = local_220;
  tcu::Format::operator<<(poVar2,&local_218);
  tcu::TestLog::operator<<(&local_3a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_3a8,(char (*) [13])"2D texture, ");
  std::__cxx11::ostringstream::str();
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3c8);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_width);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2a9098a);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_height);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])",\n  fill with ");
  local_3d8 = glu::TextureTestUtil::formatGradient
                        ((Vec4 *)&fmtName.field_0x170,(Vec4 *)(spec.valueMin.m_data + 2));
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3d8);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])0x2b88192);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_3c8);
  tcu::MessageBuilder::~MessageBuilder(&local_3a8);
  this_01 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_01;
  pTVar4 = glu::Texture2D::getRefTexture(this->m_texture);
  tcu::Texture2D::allocLevel(pTVar4,0);
  pTVar4 = glu::Texture2D::getRefTexture(this->m_texture);
  access = tcu::TextureLevelPyramid::getLevel(&pTVar4->super_TextureLevelPyramid,0);
  tcu::fillWithComponentGradients
            (access,(Vec4 *)&fmtName.field_0x170,(Vec4 *)(spec.valueMin.m_data + 2));
  iVar1 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  return iVar1;
}

Assistant:

void Texture2DFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= glu::mapGLTransferFormat(m_format, m_dataType);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	fmtName << getTextureFormatStr(m_format) << ", " << getTypeStr(m_dataType);

	log << TestLog::Message << "2D texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	// Fill level 0.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), spec.valueMin, spec.valueMax);
}